

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_39dd::test_copy(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *r_00;
  
  r = roaring64_bitmap_create();
  assert_r64_valid((roaring64_bitmap_t *)r);
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_add(r,10000);
  roaring64_bitmap_add(r,200000);
  r_00 = roaring64_bitmap_copy(r);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r_00,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r2, 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x2b);
  _Var1 = roaring64_bitmap_contains(r_00,10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r2, 10000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x2c);
  _Var1 = roaring64_bitmap_contains(r_00,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r2, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x2d);
  roaring64_bitmap_remove(r,200000);
  roaring64_bitmap_add(r,300000);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r_00,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r2, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x33);
  _Var1 = roaring64_bitmap_contains(r_00,300000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r2, 300000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x34);
  roaring64_bitmap_free(r);
  roaring64_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(test_copy) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    assert_r64_valid(r1);

    roaring64_bitmap_add(r1, 0);
    roaring64_bitmap_add(r1, 10000);
    roaring64_bitmap_add(r1, 200000);

    roaring64_bitmap_t* r2 = roaring64_bitmap_copy(r1);
    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r2, 0));
    assert_true(roaring64_bitmap_contains(r2, 10000));
    assert_true(roaring64_bitmap_contains(r2, 200000));

    roaring64_bitmap_remove(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r2, 200000));
    assert_false(roaring64_bitmap_contains(r2, 300000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}